

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateCols(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  int *piVar1;
  undefined8 uVar2;
  bool bVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Tolerances *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  DataKey *pDVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined1 uVar11;
  Result RVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  DuplicateColsPS *pDVar17;
  FixBoundsPS *pFVar18;
  pointer pDVar19;
  SPxOut *pSVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  pointer pDVar25;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  uint n;
  cpp_dec_float<200u,int,void> *pcVar31;
  cpp_dec_float<200U,_int,_void> *pcVar32;
  pointer pnVar33;
  cpp_dec_float<200U,_int,_void> *pcVar34;
  pointer pnVar35;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar36;
  undefined4 *puVar37;
  uint *puVar38;
  undefined4 *puVar39;
  cpp_dec_float<200U,_int,_void> *pcVar40;
  cpp_dec_float<200U,_int,_void> *pcVar41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var42;
  soplex *psVar43;
  ulong uVar44;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar45;
  int iVar46;
  long lVar47;
  bool bVar48;
  long in_FS_OFFSET;
  byte bVar49;
  Real RVar50;
  undefined1 auVar51 [16];
  undefined8 extraout_XMM0_Qb;
  double a;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  fpclass_type local_1128;
  int *idxMem;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10e8;
  undefined8 uStack_10e0;
  double local_10d8;
  undefined8 uStack_10d0;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  int *local_1088;
  undefined8 local_1080;
  double local_1078;
  undefined8 uStack_1070;
  long local_1068;
  undefined8 uStack_1060;
  int local_1058;
  int local_1054;
  bool *local_1050;
  undefined8 local_1048;
  shared_ptr<soplex::Tolerances> local_1040;
  shared_ptr<soplex::Tolerances> local_1030;
  shared_ptr<soplex::Tolerances> local_1020;
  shared_ptr<soplex::Tolerances> local_1010;
  shared_ptr<soplex::Tolerances> local_1000;
  shared_ptr<soplex::Tolerances> local_ff0;
  shared_ptr<soplex::Tolerances> local_fe0;
  int local_fd0;
  int local_fcc;
  int *local_fc8;
  undefined8 local_fc0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  DataArray<int> local_e90;
  DataArray<int> local_e78;
  int local_e60;
  int local_e5c;
  bool *local_e58;
  undefined8 local_e50;
  int *perm;
  int local_dd8;
  bool local_dd4;
  long local_dd0;
  DataArray<int> local_dc8;
  DataArray<int> local_db0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  cpp_dec_float<200U,_int,_void> local_d18;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined5 uStack_c30;
  undefined3 uStack_c2b;
  int iStack_c28;
  undefined1 uStack_c24;
  long local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined5 uStack_bb0;
  undefined3 uStack_bab;
  int iStack_ba8;
  undefined1 uStack_ba4;
  long local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined5 uStack_b30;
  undefined3 uStack_b2b;
  int iStack_b28;
  undefined1 uStack_b24;
  long local_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined5 uStack_ab0;
  undefined3 uStack_aab;
  int iStack_aa8;
  undefined1 uStack_aa4;
  long local_aa0;
  cpp_dec_float<200u,int,void> local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [13];
  undefined3 uStack_a2b;
  int iStack_a28;
  undefined1 uStack_a24;
  undefined8 local_a20;
  cpp_dec_float<200u,int,void> local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [13];
  undefined3 uStack_9ab;
  int iStack_9a8;
  undefined1 uStack_9a4;
  long local_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined5 uStack_930;
  undefined3 uStack_92b;
  undefined5 uStack_928;
  undefined8 local_920;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_918;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_898;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_818;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_798;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_718;
  cpp_dec_float<200U,_int,_void> local_698;
  cpp_dec_float<200U,_int,_void> local_618;
  cpp_dec_float<200U,_int,_void> local_598;
  uint local_518 [28];
  undefined4 local_4a8 [28];
  undefined4 local_438 [28];
  undefined4 local_3c8 [28];
  undefined4 local_358 [28];
  undefined4 local_2e8 [28];
  uint local_278 [28];
  uint local_208 [28];
  uint local_198 [28];
  undefined4 local_128 [28];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 local_40;
  
  bVar49 = 0;
  RVar12 = removeEmpty(this,lp);
  if (RVar12 == OKAY) {
    iVar15 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    RVar12 = OKAY;
    if (1 < iVar15) {
      local_1088 = (int *)0x0;
      local_1080 = 0x3ff3333333333333;
      spx_alloc<int*>(&local_1088,iVar15);
      iVar15 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      local_fc8 = (int *)0x0;
      local_fc0 = 0x3ff3333333333333;
      local_fd0 = 0;
      if (0 < iVar15) {
        local_fd0 = iVar15;
      }
      local_fcc = 1;
      if (0 < iVar15) {
        local_fcc = local_fd0;
      }
      spx_alloc<int*>(&local_fc8,local_fcc);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      piVar8 = idxMem;
      *local_1088 = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      iVar15 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      *local_fc8 = iVar15;
      iVar46 = 0;
      if (1 < iVar15) {
        lVar28 = 1;
        iVar46 = 0;
        lVar47 = 0x80;
        do {
          local_1088[lVar28] = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)
                     ((long)((scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar47),0.0);
          local_fc8[lVar28] = 0;
          piVar8[lVar28 + -1] = (int)lVar28;
          lVar28 = lVar28 + 1;
          iVar46 = iVar46 + 1;
          lVar47 = lVar47 + 0x80;
        } while (lVar28 < (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      local_9a0 = 0x1c00000000;
      local_a18[0] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[1] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[2] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[3] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[4] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[5] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[6] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[7] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[8] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[9] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[10] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[0xb] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[0xc] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[0xd] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[0xe] = (cpp_dec_float<200u,int,void>)0x0;
      local_a18[0xf] = (cpp_dec_float<200u,int,void>)0x0;
      local_a08 = (undefined1  [16])0x0;
      local_9f8 = (undefined1  [16])0x0;
      local_9e8 = (undefined1  [16])0x0;
      local_9d8 = (undefined1  [16])0x0;
      local_9c8 = (undefined1  [16])0x0;
      local_9b8 = SUB1613((undefined1  [16])0x0,0);
      uStack_9ab = 0;
      iStack_9a8 = 0;
      uStack_9a4 = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_a18,0.0);
      if (0 < (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar28 = 0;
        do {
          pIVar4 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          iVar15 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[lVar28].idx;
          if (0 < pIVar4[iVar15].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            pIVar4 = pIVar4 + iVar15;
            lVar29 = 0;
            lVar47 = 0;
            do {
              pNVar5 = (pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar38 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar29);
              pnVar36 = &result_3;
              for (lVar21 = 0x1c;
                  pnVar35 = scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start, lVar21 != 0;
                  lVar21 = lVar21 + -1) {
                (pnVar36->m_backend).data._M_elems[0] = *puVar38;
                puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              result_3.m_backend.exp = *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar29);
              result_3.m_backend.neg =
                   *(bool *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar29 + 4);
              result_3.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar29 + 8);
              iVar15 = *(int *)((long)(&((pIVar4->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar29);
              if (scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar15].m_backend.fpclass !=
                  cpp_dec_float_NaN) {
                result.m_backend.fpclass = cpp_dec_float_finite;
                result.m_backend.prec_elem = 0x1c;
                result.m_backend.data._M_elems[0] = 0;
                result.m_backend.data._M_elems[1] = 0;
                result.m_backend.data._M_elems[2] = 0;
                result.m_backend.data._M_elems[3] = 0;
                result.m_backend.data._M_elems[4] = 0;
                result.m_backend.data._M_elems[5] = 0;
                result.m_backend.data._M_elems[6] = 0;
                result.m_backend.data._M_elems[7] = 0;
                result.m_backend.data._M_elems[8] = 0;
                result.m_backend.data._M_elems[9] = 0;
                result.m_backend.data._M_elems[10] = 0;
                result.m_backend.data._M_elems[0xb] = 0;
                result.m_backend.data._M_elems[0xc] = 0;
                result.m_backend.data._M_elems[0xd] = 0;
                result.m_backend.data._M_elems[0xe] = 0;
                result.m_backend.data._M_elems[0xf] = 0;
                result.m_backend.data._M_elems[0x10] = 0;
                result.m_backend.data._M_elems[0x11] = 0;
                result.m_backend.data._M_elems[0x12] = 0;
                result.m_backend.data._M_elems[0x13] = 0;
                result.m_backend.data._M_elems[0x14] = 0;
                result.m_backend.data._M_elems[0x15] = 0;
                result.m_backend.data._M_elems[0x16] = 0;
                result.m_backend.data._M_elems[0x17] = 0;
                result.m_backend.data._M_elems[0x18] = 0;
                result.m_backend.data._M_elems[0x19] = 0;
                result.m_backend.data._M_elems._104_5_ = 0;
                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result.m_backend.exp = 0;
                result.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&result.m_backend,0.0);
                iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&pnVar35[iVar15].m_backend,&result.m_backend);
                if (iVar13 == 0) {
                  pnVar36 = &result_3;
                  pnVar35 = scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar15;
                  for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                    (pnVar35->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
                    pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                    pnVar35 = (pointer)((long)pnVar35 + ((ulong)bVar49 * -2 + 1) * 4);
                  }
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar15].m_backend.exp =
                       result_3.m_backend.exp;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar15].m_backend.neg =
                       result_3.m_backend.neg;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar15].m_backend.fpclass =
                       result_3.m_backend.fpclass;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar15].m_backend.prec_elem =
                       result_3.m_backend.prec_elem;
                }
              }
              iVar13 = local_1088[iVar15];
              pDVar19 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&result_3.m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar15].m_backend);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(pDVar19 + iVar13,iVar15,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&result.m_backend);
              piVar1 = local_fc8 + local_1088[iVar15];
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                lVar21 = (long)iVar46;
                iVar46 = iVar46 + 1;
                piVar8[lVar21] = local_1088[iVar15];
              }
              lVar47 = lVar47 + 1;
              iVar15 = (pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
              uVar22 = (ulong)iVar15;
              lVar29 = lVar29 + 0x84;
            } while (lVar47 < (long)uVar22);
            if (0 < iVar15) {
              pDVar19 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar47 = 0;
              do {
                iVar15 = local_1088
                         [(pIVar4->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem[lVar47].idx];
                if (0 < pDVar19[iVar15].
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused) {
                  pTVar6 = (this->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._tolerances.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  p_Var42 = (this->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                  if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
                    }
                  }
                  RVar50 = Tolerances::epsilon(pTVar6);
                  local_a20._0_4_ = cpp_dec_float_finite;
                  local_a20._4_4_ = 0x1c;
                  local_a98[0] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[1] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[2] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[3] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[4] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[5] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[6] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[7] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[8] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[9] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[10] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[0xb] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[0xc] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[0xd] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[0xe] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a98[0xf] = (cpp_dec_float<200u,int,void>)0x0;
                  local_a88 = (undefined1  [16])0x0;
                  local_a78 = (undefined1  [16])0x0;
                  local_a68 = (undefined1  [16])0x0;
                  local_a58 = (undefined1  [16])0x0;
                  local_a48 = (undefined1  [16])0x0;
                  local_a38 = SUB1613((undefined1  [16])0x0,0);
                  uStack_a2b = 0;
                  iStack_a28 = 0;
                  uStack_a24 = 0;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            (local_a98,RVar50);
                  pcVar31 = local_a98;
                  pcVar34 = &local_d18;
                  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
                    (pcVar34->data)._M_elems[0] = *(uint *)pcVar31;
                    pcVar31 = pcVar31 + (ulong)bVar49 * -8 + 4;
                    pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar34 + ((ulong)bVar49 * -2 + 1) * 4);
                  }
                  local_d18.exp = iStack_a28;
                  local_d18.neg = (bool)uStack_a24;
                  local_d18.fpclass = (fpclass_type)local_a20;
                  local_d18.prec_elem = local_a20._4_4_;
                  if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var42);
                  }
                  pDVar19 = (this->m_classSetCols).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  iVar13 = pDVar19[iVar15].
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
                  if (1 < iVar13) {
                    SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                              (pDVar19[iVar15].
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem,iVar13,(ElementCompare *)&local_d18,0,true);
                    pDVar19 = (this->m_classSetCols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  iVar13 = *piVar8;
                  lVar29 = (long)iVar46;
                  iVar46 = iVar46 + -1;
                  *piVar8 = piVar8[lVar29 + -1];
                  if (0 < pDVar19[iVar15].
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused) {
                    pSVar26 = &pDVar19[iVar15].
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ;
                    lVar29 = 0;
                    lVar21 = 0;
                    do {
                      uVar11 = uStack_9a4;
                      iVar14 = iStack_9a8;
                      if (lVar29 != 0) {
                        puVar37 = (undefined4 *)
                                  ((long)(pSVar26->m_elem->val).m_backend.data._M_elems + lVar29);
                        puVar39 = local_128;
                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                          *puVar39 = *puVar37;
                          puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                          puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
                        }
                        pcVar31 = local_a18;
                        puVar38 = local_198;
                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                          *puVar38 = *(uint *)pcVar31;
                          pcVar31 = pcVar31 + ((ulong)bVar49 * -2 + 1) * 4;
                          puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                        }
                        local_1068 = local_9a0;
                        uStack_1060 = 0;
                        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_598,this);
                        puVar37 = local_128;
                        psVar43 = (soplex *)&ptr_1;
                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                          *(undefined4 *)psVar43 = *puVar37;
                          puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                          psVar43 = psVar43 + (ulong)bVar49 * -8 + 4;
                        }
                        puVar38 = local_198;
                        pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&perm;
                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                          (pnVar36->m_backend).data._M_elems[0] = *puVar38;
                          puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                          pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                        }
                        local_dd8 = iVar14;
                        local_dd4 = (bool)uVar11;
                        local_dd0 = local_1068;
                        relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                  (&result_3,(soplex *)&ptr_1,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&perm,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)0x0);
                        pnVar36 = &result_3;
                        pcVar34 = &result.m_backend;
                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                          (pcVar34->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
                          pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                          pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                        }
                        result.m_backend.exp = result_3.m_backend.exp;
                        result.m_backend.neg = result_3.m_backend.neg;
                        result.m_backend.fpclass = result_3.m_backend.fpclass;
                        result.m_backend.prec_elem = result_3.m_backend.prec_elem;
                        if ((result_3.m_backend.neg == true) &&
                           (result.m_backend.data._M_elems[0] != 0 ||
                            result_3.m_backend.fpclass != cpp_dec_float_finite)) {
                          result.m_backend.neg = false;
                        }
                        if (((result_3.m_backend.fpclass != cpp_dec_float_NaN) &&
                            (local_598.fpclass != cpp_dec_float_NaN)) &&
                           (iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>
                                     ::compare(&result.m_backend,&local_598), 0 < iVar14)) {
                          iVar13 = *piVar8;
                          lVar23 = (long)iVar46;
                          iVar46 = iVar46 + -1;
                          *piVar8 = piVar8[lVar23 + -1];
                        }
                      }
                      pDVar19 = (this->m_classSetCols).data.
                                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pSVar26 = &pDVar19[iVar15].
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ;
                      pNVar5 = pSVar26->m_elem;
                      local_1088[*(int *)((long)(&pNVar5->val + 1) + lVar29)] = iVar13;
                      local_fc8[iVar13] = local_fc8[iVar13] + 1;
                      puVar37 = (undefined4 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar29)
                      ;
                      pcVar31 = local_a18;
                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                        *(undefined4 *)pcVar31 = *puVar37;
                        puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                        pcVar31 = pcVar31 + ((ulong)bVar49 * -2 + 1) * 4;
                      }
                      iStack_9a8 = *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar29);
                      uStack_9a4 = *(bool *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar29 + 4U
                                            );
                      local_9a0 = *(long *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar29 + 8U)
                      ;
                      lVar21 = lVar21 + 1;
                      lVar29 = lVar29 + 0x84;
                    } while (lVar21 < pDVar19[iVar15].
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .memused);
                  }
                  pDVar19[iVar15].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused = 0;
                  uVar22 = (ulong)(uint)(pIVar4->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .memused;
                }
                lVar47 = lVar47 + 1;
              } while (lVar47 < (int)uVar22);
            }
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < (lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      free(idxMem);
      idxMem = (int *)0x0;
      local_1054 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
      local_1050 = (bool *)0x0;
      local_1048 = 0x3ff3333333333333;
      local_1058 = local_1054;
      if (local_1054 < 1) {
        local_1054 = 1;
        local_1058 = 0;
      }
      spx_alloc<bool*>(&local_1050,local_1054);
      local_e5c = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
      local_e58 = (bool *)0x0;
      local_e50 = 0x3ff3333333333333;
      local_e60 = local_e5c;
      if (local_e5c < 1) {
        local_e5c = 1;
        local_e60 = 0;
      }
      spx_alloc<bool*>(&local_e58,local_e5c);
      auVar9 = _DAT_005f4040;
      iVar15 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (0 < (long)iVar15) {
        pDVar19 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar28 = (long)iVar15 + -1;
        auVar51._8_4_ = (int)lVar28;
        auVar51._0_8_ = lVar28;
        auVar51._12_4_ = (int)((ulong)lVar28 >> 0x20);
        lVar28 = 0;
        auVar51 = auVar51 ^ _DAT_005f4040;
        auVar52 = _DAT_005f4020;
        auVar53 = _DAT_005f4030;
        do {
          auVar54 = auVar53 ^ auVar9;
          iVar46 = auVar51._4_4_;
          if ((bool)(~(auVar54._4_4_ == iVar46 && auVar51._0_4_ < auVar54._0_4_ ||
                      iVar46 < auVar54._4_4_) & 1)) {
            *(undefined4 *)
             ((long)&(pDVar19->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).memused + lVar28) = 0;
          }
          if ((auVar54._12_4_ != auVar51._12_4_ || auVar54._8_4_ <= auVar51._8_4_) &&
              auVar54._12_4_ <= auVar51._12_4_) {
            *(undefined4 *)
             ((long)&pDVar19[1].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar28) = 0;
          }
          auVar54 = auVar52 ^ auVar9;
          iVar13 = auVar54._4_4_;
          if (iVar13 <= iVar46 && (iVar13 != iVar46 || auVar54._0_4_ <= auVar51._0_4_)) {
            *(undefined4 *)
             ((long)&pDVar19[2].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar28) = 0;
            *(undefined4 *)
             ((long)&pDVar19[3].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar28) = 0;
          }
          lVar47 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + 4;
          auVar53._8_8_ = lVar47 + 4;
          lVar47 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + 4;
          auVar52._8_8_ = lVar47 + 4;
          lVar28 = lVar28 + 0x80;
        } while ((ulong)(iVar15 + 3U >> 2) << 7 != lVar28);
        if (0 < iVar15) {
          lVar28 = 0;
          do {
            local_1050[lVar28] = false;
            local_e58[lVar28] = false;
            iVar15 = local_1088[lVar28];
            pDVar19 = (this->m_dupCols).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&result,0.0);
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(pDVar19 + iVar15,(int)lVar28,&result);
            lVar28 = lVar28 + 1;
          } while (lVar28 < (lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
      }
      local_db0.data = (int *)0x0;
      local_db0.memFactor = 1.2;
      local_db0.thesize = 0;
      local_db0.themax = 1;
      spx_alloc<int*>(&local_db0.data,1);
      uVar27 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if ((int)uVar27 < 1) {
        bVar48 = false;
      }
      else {
        this_00 = &this->m_hist;
        local_10d8 = *(double *)(in_FS_OFFSET + -8);
        uStack_10d0 = 0;
        a = -local_10d8;
        pDVar19 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar28 = 0;
        bVar48 = false;
        do {
          if ((1 < pDVar19[lVar28].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused) &&
             ((lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem
              [(lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey
               [(pDVar19[lVar28].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->idx].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused != 1)) {
            if (!bVar48) {
              pDVar17 = (DuplicateColsPS *)operator_new(0x2d0);
              local_920 = 0x1c00000000;
              local_998 = 0;
              uStack_990 = 0;
              local_988 = 0;
              uStack_980 = 0;
              local_978 = 0;
              uStack_970 = 0;
              local_968 = 0;
              uStack_960 = 0;
              local_958 = 0;
              uStack_950 = 0;
              local_948 = 0;
              uStack_940 = 0;
              local_938 = 0;
              uStack_930 = 0;
              uStack_92b = 0;
              uStack_928 = 0;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_998,1.0);
              DataArray<int>::DataArray(&local_dc8,&local_db0);
              local_fe0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_fe0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_fe0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_fe0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_fe0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_fe0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_fe0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              DuplicateColsPS::DuplicateColsPS
                        (pDVar17,lp,0,0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_998,&local_dc8,&local_fe0,true,false);
              result.m_backend.data._M_elems._0_8_ = pDVar17;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         (result.m_backend.data._M_elems + 2),pDVar17);
              if (local_fe0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_fe0.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_dc8.data != (int *)0x0) {
                free(local_dc8.data);
                local_dc8.data = (int *)0x0;
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&this_00->data,(value_type *)&result);
              if (result.m_backend.data._M_elems._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           result.m_backend.data._M_elems._8_8_);
              }
              pDVar19 = (this->m_dupCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar48 = true;
            }
            if (0 < pDVar19[lVar28].
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
              local_1068 = 0;
              do {
                if (0 < pDVar19[lVar28].
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused) {
                  pDVar25 = pDVar19 + lVar28;
                  lVar29 = 0x80;
                  lVar47 = 0;
                  do {
                    if (local_1068 != lVar47) {
                      pNVar5 = (pDVar25->
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).m_elem;
                      iVar15 = pNVar5[local_1068].idx;
                      lVar21 = (long)iVar15;
                      if (local_1050[lVar21] == false) {
                        uVar27 = *(uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar29);
                        lVar23 = (long)(int)uVar27;
                        if (local_1050[lVar23] == false) {
                          pnVar35 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).object.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pnVar33 = pnVar35 + lVar21;
                          puVar38 = local_208;
                          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                            *puVar38 = (pnVar33->m_backend).data._M_elems[0];
                            pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar49 * -2 + 1) * 4);
                            puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                          }
                          iVar46 = pnVar35[lVar21].m_backend.exp;
                          bVar3 = pnVar35[lVar21].m_backend.neg;
                          uVar2._0_4_ = pnVar35[lVar21].m_backend.fpclass;
                          uVar2._4_4_ = pnVar35[lVar21].m_backend.prec_elem;
                          pnVar33 = pnVar35 + lVar23;
                          pcVar34 = &local_d18;
                          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                            (pcVar34->data)._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
                            pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar49 * -2 + 1) * 4);
                            pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                          }
                          local_d18.exp = pnVar35[lVar23].m_backend.exp;
                          local_d18.neg = pnVar35[lVar23].m_backend.neg;
                          local_d18.fpclass = pnVar35[lVar23].m_backend.fpclass;
                          local_d18.prec_elem = pnVar35[lVar23].m_backend.prec_elem;
                          factor.m_backend.fpclass = cpp_dec_float_finite;
                          factor.m_backend.prec_elem = 0x1c;
                          factor.m_backend.data._M_elems[0] = 0;
                          factor.m_backend.data._M_elems[1] = 0;
                          factor.m_backend.data._M_elems[2] = 0;
                          factor.m_backend.data._M_elems[3] = 0;
                          factor.m_backend.data._M_elems[4] = 0;
                          factor.m_backend.data._M_elems[5] = 0;
                          factor.m_backend.data._M_elems[6] = 0;
                          factor.m_backend.data._M_elems[7] = 0;
                          factor.m_backend.data._M_elems[8] = 0;
                          factor.m_backend.data._M_elems[9] = 0;
                          factor.m_backend.data._M_elems[10] = 0;
                          factor.m_backend.data._M_elems[0xb] = 0;
                          factor.m_backend.data._M_elems[0xc] = 0;
                          factor.m_backend.data._M_elems[0xd] = 0;
                          factor.m_backend.data._M_elems[0xe] = 0;
                          factor.m_backend.data._M_elems[0xf] = 0;
                          factor.m_backend.data._M_elems[0x10] = 0;
                          factor.m_backend.data._M_elems[0x11] = 0;
                          factor.m_backend.data._M_elems[0x12] = 0;
                          factor.m_backend.data._M_elems[0x13] = 0;
                          factor.m_backend.data._M_elems[0x14] = 0;
                          factor.m_backend.data._M_elems[0x15] = 0;
                          factor.m_backend.data._M_elems[0x16] = 0;
                          factor.m_backend.data._M_elems[0x17] = 0;
                          factor.m_backend.data._M_elems[0x18] = 0;
                          factor.m_backend.data._M_elems[0x19] = 0;
                          factor.m_backend.data._M_elems._104_5_ = 0;
                          factor.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                          factor.m_backend.exp = 0;
                          factor.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                    (&factor.m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar21].m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend);
                          pcVar32 = &scale.data.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar21].m_backend;
                          result_3.m_backend.fpclass = cpp_dec_float_finite;
                          result_3.m_backend.prec_elem = 0x1c;
                          result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                          result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                          result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                          result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                          result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                          result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                          result_3.m_backend.data._M_elems[0x18] = 0;
                          result_3.m_backend.data._M_elems[0x19] = 0;
                          result_3.m_backend.data._M_elems._104_5_ = 0;
                          result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                          result_3.m_backend.exp = 0;
                          result_3.m_backend.neg = false;
                          pcVar34 = &local_d18;
                          if (&result_3.m_backend != pcVar32) {
                            pcVar41 = &result_3.m_backend;
                            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                              (pcVar41->data)._M_elems[0] = (pcVar34->data)._M_elems[0];
                              pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                        ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                              pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                                        ((long)pcVar41 + (ulong)bVar49 * -8 + 4);
                            }
                            result_3.m_backend.exp = local_d18.exp;
                            result_3.m_backend.neg = local_d18.neg;
                            result_3.m_backend.fpclass = local_d18.fpclass;
                            result_3.m_backend.prec_elem = local_d18.prec_elem;
                            pcVar34 = pcVar32;
                          }
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          operator*=(&result_3.m_backend,pcVar34);
                          result.m_backend.fpclass = cpp_dec_float_finite;
                          result.m_backend.prec_elem = 0x1c;
                          result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems[0x18] = 0;
                          result.m_backend.data._M_elems[0x19] = 0;
                          result.m_backend.data._M_elems._104_5_ = 0;
                          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                          result.m_backend.exp = 0;
                          result.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                    (&result.m_backend,&result_3.m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend);
                          puVar38 = local_208;
                          pcVar34 = &result_4.m_backend;
                          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                            (pcVar34->data)._M_elems[0] = *puVar38;
                            puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                            pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                          }
                          result_4.m_backend.exp = iVar46;
                          result_4.m_backend.neg = bVar3;
                          result_4.m_backend._120_8_ = uVar2;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          operator-=(&result_4.m_backend,&result.m_backend);
                          uVar2 = result_4.m_backend._120_8_;
                          bVar3 = result_4.m_backend.neg;
                          iVar46 = result_4.m_backend.exp;
                          pnVar36 = &result_4;
                          puVar38 = local_278;
                          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                            *puVar38 = (pnVar36->m_backend).data._M_elems[0];
                            pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                            puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                          }
                          epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_618,this);
                          puVar38 = local_278;
                          pcVar34 = &result.m_backend;
                          for (lVar24 = 0x1c; uVar10 = result_4.m_backend._120_8_, lVar24 != 0;
                              lVar24 = lVar24 + -1) {
                            (pcVar34->data)._M_elems[0] = *puVar38;
                            puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                            pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                          }
                          result.m_backend.exp = iVar46;
                          result.m_backend.neg = bVar3;
                          local_1128 = (fpclass_type)uVar2;
                          result_4.m_backend.fpclass = (fpclass_type)uVar2;
                          result_4.m_backend.prec_elem = SUB84(uVar2,4);
                          result.m_backend.fpclass = result_4.m_backend.fpclass;
                          result.m_backend.prec_elem = result_4.m_backend.prec_elem;
                          if ((bVar3 != false) &&
                             (result.m_backend.data._M_elems[0] != 0 ||
                              local_1128 != cpp_dec_float_finite)) {
                            result.m_backend.neg = (bool)(bVar3 ^ 1);
                          }
                          result_4.m_backend._120_8_ = uVar10;
                          if (((local_1128 == cpp_dec_float_NaN) ||
                              (local_618.fpclass == cpp_dec_float_NaN)) ||
                             (iVar46 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 (&result.m_backend,&local_618), 0 < iVar46)) {
                            pcVar34 = &(lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend;
                            ::soplex::infinity::__tls_init();
                            result.m_backend.fpclass = cpp_dec_float_finite;
                            result.m_backend.prec_elem = 0x1c;
                            result.m_backend.data._M_elems[0] = 0;
                            result.m_backend.data._M_elems[1] = 0;
                            result.m_backend.data._M_elems[2] = 0;
                            result.m_backend.data._M_elems[3] = 0;
                            result.m_backend.data._M_elems[4] = 0;
                            result.m_backend.data._M_elems[5] = 0;
                            result.m_backend.data._M_elems[6] = 0;
                            result.m_backend.data._M_elems[7] = 0;
                            result.m_backend.data._M_elems[8] = 0;
                            result.m_backend.data._M_elems[9] = 0;
                            result.m_backend.data._M_elems[10] = 0;
                            result.m_backend.data._M_elems[0xb] = 0;
                            result.m_backend.data._M_elems[0xc] = 0;
                            result.m_backend.data._M_elems[0xd] = 0;
                            result.m_backend.data._M_elems[0xe] = 0;
                            result.m_backend.data._M_elems[0xf] = 0;
                            result.m_backend.data._M_elems[0x10] = 0;
                            result.m_backend.data._M_elems[0x11] = 0;
                            result.m_backend.data._M_elems[0x12] = 0;
                            result.m_backend.data._M_elems[0x13] = 0;
                            result.m_backend.data._M_elems[0x14] = 0;
                            result.m_backend.data._M_elems[0x15] = 0;
                            result.m_backend.data._M_elems[0x16] = 0;
                            result.m_backend.data._M_elems[0x17] = 0;
                            result.m_backend.data._M_elems[0x18] = 0;
                            result.m_backend.data._M_elems[0x19] = 0;
                            result.m_backend.data._M_elems._104_5_ = 0;
                            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                            result.m_backend.exp = 0;
                            result.m_backend.neg = false;
                            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                      ((cpp_dec_float<200u,int,void> *)&result.m_backend,a);
                            if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                               (iVar46 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (pcVar34,&result.m_backend), 0 < iVar46)) {
                              pcVar34 = &(lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend
                              ;
                              ::soplex::infinity::__tls_init();
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 0x1c;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[0x18] = 0;
                              result.m_backend.data._M_elems[0x19] = 0;
                              result.m_backend.data._M_elems._104_5_ = 0;
                              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                              operator=((cpp_dec_float<200u,int,void> *)&result.m_backend,local_10d8
                                       );
                              if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                  (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                 ((iVar46 = boost::multiprecision::backends::
                                            cpp_dec_float<200U,_int,_void>::compare
                                                      (pcVar34,&result.m_backend), iVar46 < 0 ||
                                  (factor.m_backend.fpclass == cpp_dec_float_NaN))))
                              goto LAB_00560fee;
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar46 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 (&factor.m_backend,&result.m_backend);
                              if ((iVar46 < 0) && (result_4.m_backend.fpclass != cpp_dec_float_NaN))
                              {
                                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar46 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&result_4.m_backend,&result.m_backend);
                                if (iVar46 < 1) goto LAB_0055f392;
                                pcVar34 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,local_10d8);
                                if (((pcVar34->fpclass != cpp_dec_float_NaN) &&
                                    (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                   (iVar46 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (pcVar34,&result.m_backend), -1 < iVar46))
                                goto LAB_005615ab;
                                pnVar35 = (lp->
                                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).up.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                                pFVar18 = (FixBoundsPS *)operator_new(0x30);
                                pnVar33 = pnVar35 + lVar21;
                                pnVar36 = &local_898;
                                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                  (pnVar36->m_backend).data._M_elems[0] =
                                       (pnVar33->m_backend).data._M_elems[0];
                                  pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar49 * -2 + 1) * 4);
                                  pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                                }
                                local_898.m_backend.exp = pnVar35[lVar21].m_backend.exp;
                                local_898.m_backend.neg = pnVar35[lVar21].m_backend.neg;
                                local_898.m_backend.fpclass = pnVar35[lVar21].m_backend.fpclass;
                                local_898.m_backend.prec_elem = pnVar35[lVar21].m_backend.prec_elem;
                                local_1020.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_1020.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     (this->
                                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                                if (local_1020.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_1020.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_1020.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_1020.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_1020.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                                FixBoundsPS::FixBoundsPS(pFVar18,lp,iVar15,&local_898,&local_1020);
                                result.m_backend.data._M_elems._0_8_ = pFVar18;
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                           (result.m_backend.data._M_elems + 2),pFVar18);
                                if (local_1020.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_1020.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                }
                                std::
                                vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                ::push_back(&this_00->data,(value_type *)&result);
                                (*(lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._vptr_ClassArray[0x2a])
                                          (lp,lVar21,
                                           (lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar21,0);
joined_r0x0056095a:
                                p_Var42 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          result.m_backend.data._M_elems._8_8_;
                                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    result.m_backend.data._M_elems._8_8_ !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00560fe9:
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (p_Var42);
                                }
                              }
                              else {
LAB_0055f392:
                                if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar46 = boost::multiprecision::backends::
                                           cpp_dec_float<200U,_int,_void>::compare
                                                     (&factor.m_backend,&result.m_backend);
                                  if ((0 < iVar46) &&
                                     (result_4.m_backend.fpclass != cpp_dec_float_NaN)) {
                                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>
                                    ::cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                    iVar46 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (&result_4.m_backend,&result.m_backend);
                                    if (iVar46 < 0) {
                                      pcVar34 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 0x1c;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[0x18] = 0;
                                      result.m_backend.data._M_elems[0x19] = 0;
                                      result.m_backend.data._M_elems._104_5_ = 0;
                                      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&result.m_backend,
                                                  a);
                                      if (((pcVar34->fpclass != cpp_dec_float_NaN) &&
                                          (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                         (iVar46 = boost::multiprecision::backends::
                                                   cpp_dec_float<200U,_int,_void>::compare
                                                             (pcVar34,&result.m_backend), iVar46 < 1
                                         )) goto LAB_005615ab;
                                      pnVar35 = (lp->
                                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).low.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start;
                                      pFVar18 = (FixBoundsPS *)operator_new(0x30);
                                      pnVar33 = pnVar35 + lVar21;
                                      pnVar36 = &local_918;
                                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                        (pnVar36->m_backend).data._M_elems[0] =
                                             (pnVar33->m_backend).data._M_elems[0];
                                        pnVar33 = (pointer)((long)pnVar33 +
                                                           ((ulong)bVar49 * -2 + 1) * 4);
                                        pnVar36 = (
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                                      }
                                      local_918.m_backend.exp = pnVar35[lVar21].m_backend.exp;
                                      local_918.m_backend.neg = pnVar35[lVar21].m_backend.neg;
                                      local_918.m_backend.fpclass =
                                           pnVar35[lVar21].m_backend.fpclass;
                                      local_918.m_backend.prec_elem =
                                           pnVar35[lVar21].m_backend.prec_elem;
                                      local_1030.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = (this->
                                                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                )._tolerances.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr;
                                      local_1030.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi =
                                           (this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                                      if (local_1030.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          (local_1030.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_1030.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          (local_1030.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_1030.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                        }
                                      }
                                      FixBoundsPS::FixBoundsPS
                                                (pFVar18,lp,iVar15,&local_918,&local_1030);
                                      result.m_backend.data._M_elems._0_8_ = pFVar18;
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                 (result.m_backend.data._M_elems + 2),pFVar18);
                                      if (local_1030.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(local_1030.
                                                                                                      
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                      }
                                      std::
                                      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                      ::push_back(&this_00->data,(value_type *)&result);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2d])
                                                (lp,lVar21,
                                                 (lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar21,
                                                 0);
                                      goto joined_r0x0056095a;
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              if (factor.m_backend.fpclass == cpp_dec_float_NaN) goto LAB_00560fee;
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar46 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 (&factor.m_backend,&result.m_backend);
                              if ((0 < iVar46) && (result_4.m_backend.fpclass != cpp_dec_float_NaN))
                              {
                                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar46 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&result_4.m_backend,&result.m_backend);
                                if (iVar46 < 1) goto LAB_0055f538;
                                pcVar34 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,local_10d8);
                                if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar46 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (pcVar34,&result.m_backend), iVar46 < 0)) {
                                  pnVar35 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).up.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pFVar18 = (FixBoundsPS *)operator_new(0x30);
                                  pnVar33 = pnVar35 + lVar21;
                                  pnVar36 = &local_798;
                                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                    (pnVar36->m_backend).data._M_elems[0] =
                                         (pnVar33->m_backend).data._M_elems[0];
                                    pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar49 * -2 + 1) * 4
                                                       );
                                    pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                                  }
                                  local_798.m_backend.exp = pnVar35[lVar21].m_backend.exp;
                                  local_798.m_backend.neg = pnVar35[lVar21].m_backend.neg;
                                  local_798.m_backend.fpclass = pnVar35[lVar21].m_backend.fpclass;
                                  local_798.m_backend.prec_elem =
                                       pnVar35[lVar21].m_backend.prec_elem;
                                  local_1000.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (this->
                                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            )._tolerances.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr;
                                  local_1000.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi =
                                       (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                                  if (local_1000.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      (local_1000.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_use_count =
                                           (local_1000.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      (local_1000.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_use_count =
                                           (local_1000.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                    }
                                  }
                                  FixBoundsPS::FixBoundsPS(pFVar18,lp,iVar15,&local_798,&local_1000)
                                  ;
                                  result.m_backend.data._M_elems._0_8_ = pFVar18;
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                             (result.m_backend.data._M_elems + 2),pFVar18);
                                  if (local_1000.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_1000.
                                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
                                  }
                                  std::
                                  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                  ::push_back(&this_00->data,(value_type *)&result);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])
                                            (lp,lVar21,
                                             (lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar21,0);
                                  p_Var42 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            result.m_backend.data._M_elems._8_8_;
                                  if (result.m_backend.data._M_elems._8_8_ == 0) goto LAB_00560fee;
                                  goto LAB_00560fe9;
                                }
LAB_005615ab:
                                RVar12 = UNBOUNDED;
                                goto LAB_00561849;
                              }
LAB_0055f538:
                              if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar46 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&factor.m_backend,&result.m_backend);
                                if ((iVar46 < 0) &&
                                   (result_4.m_backend.fpclass != cpp_dec_float_NaN)) {
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar46 = boost::multiprecision::backends::
                                           cpp_dec_float<200U,_int,_void>::compare
                                                     (&result_4.m_backend,&result.m_backend);
                                  if (iVar46 < 0) {
                                    pcVar34 = &(lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result.m_backend,a);
                                    if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar46 = boost::multiprecision::backends::
                                                 cpp_dec_float<200U,_int,_void>::compare
                                                           (pcVar34,&result.m_backend), 0 < iVar46))
                                    {
                                      pnVar35 = (lp->
                                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).low.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start;
                                      pFVar18 = (FixBoundsPS *)operator_new(0x30);
                                      pnVar33 = pnVar35 + lVar21;
                                      pnVar36 = &local_818;
                                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                        (pnVar36->m_backend).data._M_elems[0] =
                                             (pnVar33->m_backend).data._M_elems[0];
                                        pnVar33 = (pointer)((long)pnVar33 +
                                                           ((ulong)bVar49 * -2 + 1) * 4);
                                        pnVar36 = (
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                                      }
                                      local_818.m_backend.exp = pnVar35[lVar21].m_backend.exp;
                                      local_818.m_backend.neg = pnVar35[lVar21].m_backend.neg;
                                      local_818.m_backend.fpclass =
                                           pnVar35[lVar21].m_backend.fpclass;
                                      local_818.m_backend.prec_elem =
                                           pnVar35[lVar21].m_backend.prec_elem;
                                      local_1010.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = (this->
                                                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                )._tolerances.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr;
                                      local_1010.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi =
                                           (this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                                      if (local_1010.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          (local_1010.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_1010.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          (local_1010.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_1010.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                        }
                                      }
                                      FixBoundsPS::FixBoundsPS
                                                (pFVar18,lp,iVar15,&local_818,&local_1010);
                                      result.m_backend.data._M_elems._0_8_ = pFVar18;
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                 (result.m_backend.data._M_elems + 2),pFVar18);
                                      if (local_1010.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(local_1010.
                                                                                                      
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                      }
                                      std::
                                      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                      ::push_back(&this_00->data,(value_type *)&result);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2d])
                                                (lp,lVar21,
                                                 (lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar21,
                                                 0);
                                      goto joined_r0x0056095a;
                                    }
                                    goto LAB_005615ab;
                                  }
                                }
                              }
                            }
LAB_00560fee:
                            pnVar35 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).low.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar21;
                            puVar37 = local_4a8;
                            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                              *puVar37 = (pnVar35->m_backend).data._M_elems[0];
                              pnVar35 = (pointer)((long)pnVar35 + ((ulong)bVar49 * -2 + 1) * 4);
                              puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                            }
                            pnVar35 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).up.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            pnVar33 = pnVar35 + lVar21;
                            puVar38 = local_518;
                            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                              *puVar38 = (pnVar33->m_backend).data._M_elems[0];
                              pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar49 * -2 + 1) * 4);
                              puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                            }
                            iVar15 = pnVar35[lVar21].m_backend.exp;
                            bVar3 = pnVar35[lVar21].m_backend.neg;
                            lVar23._0_4_ = pnVar35[lVar21].m_backend.fpclass;
                            lVar23._4_4_ = pnVar35[lVar21].m_backend.prec_elem;
                            feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_698,this);
                            puVar37 = local_4a8;
                            psVar43 = (soplex *)&ptr_1;
                            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                              *(undefined4 *)psVar43 = *puVar37;
                              puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                              psVar43 = psVar43 + (ulong)bVar49 * -8 + 4;
                            }
                            puVar38 = local_518;
                            pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&perm;
                            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                              (pnVar36->m_backend).data._M_elems[0] = *puVar38;
                              puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                              pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                            }
                            local_dd8 = iVar15;
                            local_dd4 = bVar3;
                            local_dd0 = lVar23;
                            relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                      (&result_3,(soplex *)&ptr_1,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&perm,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)0x0);
                            pnVar36 = &result_3;
                            pcVar34 = &result.m_backend;
                            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                              (pcVar34->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
                              pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                              pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                        ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                            }
                            result.m_backend.exp = result_3.m_backend.exp;
                            result.m_backend.neg = result_3.m_backend.neg;
                            result.m_backend.fpclass = result_3.m_backend.fpclass;
                            result.m_backend.prec_elem = result_3.m_backend.prec_elem;
                            if ((result_3.m_backend.neg == true) &&
                               (result.m_backend.data._M_elems[0] != 0 ||
                                result_3.m_backend.fpclass != cpp_dec_float_finite)) {
                              result.m_backend.neg = false;
                            }
                            if (((result_3.m_backend.fpclass != cpp_dec_float_NaN) &&
                                (local_698.fpclass != cpp_dec_float_NaN)) &&
                               (iVar15 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&result.m_backend,&local_698), iVar15 < 1)) {
                              local_1050[lVar21] = true;
                              local_e58[lVar21] = true;
                              piVar8 = (this->m_stat).data + 0xd;
                              *piVar8 = *piVar8 + 1;
                            }
                          }
                          else {
                            pnVar35 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).low.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar21;
                            puVar37 = local_2e8;
                            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                              *puVar37 = (pnVar35->m_backend).data._M_elems[0];
                              pnVar35 = (pointer)((long)pnVar35 + ((ulong)bVar49 * -2 + 1) * 4);
                              puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                            }
                            local_aa0 = 0x1c00000000;
                            local_b18 = 0;
                            uStack_b10 = 0;
                            local_b08 = 0;
                            uStack_b00 = 0;
                            local_af8 = 0;
                            uStack_af0 = 0;
                            local_ae8 = 0;
                            uStack_ae0 = 0;
                            local_ad8 = 0;
                            uStack_ad0 = 0;
                            local_ac8 = 0;
                            uStack_ac0 = 0;
                            local_ab8 = 0;
                            uStack_ab0 = 0;
                            uStack_aab = 0;
                            iStack_aa8 = 0;
                            uStack_aa4 = 0;
                            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                      ((cpp_dec_float<200u,int,void> *)&local_b18,0.0);
                            pTVar6 = (this->
                                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            p_Var42 = (this->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      )._tolerances.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi;
                            if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
                              }
                            }
                            local_10e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         Tolerances::epsilon(pTVar6);
                            puVar37 = local_2e8;
                            psVar43 = (soplex *)&ptr_1;
                            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                              *(undefined4 *)psVar43 = *puVar37;
                              puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                              psVar43 = psVar43 + (ulong)bVar49 * -8 + 4;
                            }
                            puVar38 = (uint *)&local_b18;
                            pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&perm;
                            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                              (pnVar36->m_backend).data._M_elems[0] = *puVar38;
                              puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                              pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                            }
                            local_dd8 = iStack_aa8;
                            local_dd4 = (bool)uStack_aa4;
                            local_dd0 = local_aa0;
                            relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                      (&result_3,(soplex *)&ptr_1,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&perm,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)0x0);
                            if ((NAN((double)local_10e8)) ||
                               (result_3.m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_0055f80b:
                              bVar3 = false;
                            }
                            else {
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 0x1c;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[0x18] = 0;
                              result.m_backend.data._M_elems[0x19] = 0;
                              result.m_backend.data._M_elems._104_5_ = 0;
                              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                              operator=((cpp_dec_float<200u,int,void> *)&result,(double)local_10e8);
                              iVar46 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 (&result_3.m_backend,&result.m_backend);
                              if (0 < iVar46) goto LAB_0055f80b;
                              pnVar35 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pnVar33 = pnVar35 + lVar21;
                              puVar37 = local_358;
                              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                *puVar37 = (pnVar33->m_backend).data._M_elems[0];
                                pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar49 * -2 + 1) * 4);
                                puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                              }
                              local_10e8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                            &pnVar35[lVar21].m_backend.fpclass;
                              uStack_10e0 = 0;
                              local_b20 = 0x1c00000000;
                              local_b98 = 0;
                              uStack_b90 = 0;
                              local_b88 = 0;
                              uStack_b80 = 0;
                              local_b78 = 0;
                              uStack_b70 = 0;
                              local_b68 = 0;
                              uStack_b60 = 0;
                              local_b58 = 0;
                              uStack_b50 = 0;
                              local_b48 = 0;
                              uStack_b40 = 0;
                              local_b38 = 0;
                              uStack_b30 = 0;
                              uStack_b2b = 0;
                              iStack_b28 = 0;
                              uStack_b24 = 0;
                              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                              operator=((cpp_dec_float<200u,int,void> *)&local_b98,0.0);
                              pTVar6 = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              this_01 = (this->
                                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        )._tolerances.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  this_01->_M_use_count = this_01->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  this_01->_M_use_count = this_01->_M_use_count + 1;
                                }
                              }
                              local_1078 = Tolerances::epsilon(pTVar6);
                              uStack_1070 = extraout_XMM0_Qb;
                              puVar37 = local_358;
                              psVar43 = (soplex *)&ptr_1;
                              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                *(undefined4 *)psVar43 = *puVar37;
                                puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                                psVar43 = psVar43 + (ulong)bVar49 * -8 + 4;
                              }
                              puVar38 = (uint *)&local_b98;
                              pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&perm;
                              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                (pnVar36->m_backend).data._M_elems[0] = *puVar38;
                                puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                                pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                              }
                              local_dd8 = iStack_b28;
                              local_dd4 = (bool)uStack_b24;
                              local_dd0 = local_b20;
                              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                        (&result_3,(soplex *)&ptr_1,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&perm,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x0);
                              if ((NAN(local_1078)) ||
                                 (result_3.m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_005606c7:
                                bVar3 = false;
                              }
                              else {
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,-local_1078);
                                iVar46 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&result_3.m_backend,&result.m_backend);
                                if (iVar46 < 1) goto LAB_005606c7;
                                pnVar35 = (lp->
                                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).low.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                                pnVar33 = pnVar35 + lVar23;
                                puVar37 = local_3c8;
                                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                  *puVar37 = (pnVar33->m_backend).data._M_elems[0];
                                  pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar49 * -2 + 1) * 4);
                                  puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                                }
                                local_1078 = *(double *)&pnVar35[lVar23].m_backend.fpclass;
                                uStack_1070 = 0;
                                local_ba0 = 0x1c00000000;
                                local_c18 = 0;
                                uStack_c10 = 0;
                                local_c08 = 0;
                                uStack_c00 = 0;
                                local_bf8 = 0;
                                uStack_bf0 = 0;
                                local_be8 = 0;
                                uStack_be0 = 0;
                                local_bd8 = 0;
                                uStack_bd0 = 0;
                                local_bc8 = 0;
                                uStack_bc0 = 0;
                                local_bb8 = 0;
                                uStack_bb0 = 0;
                                uStack_bab = 0;
                                iStack_ba8 = 0;
                                uStack_ba4 = 0;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&local_c18,0.0);
                                pTVar6 = (this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_10e8 = (this->
                                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi;
                                if (local_10e8 !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    local_10e8->_M_use_count = local_10e8->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    local_10e8->_M_use_count = local_10e8->_M_use_count + 1;
                                  }
                                }
                                RVar50 = Tolerances::epsilon(pTVar6);
                                puVar37 = local_3c8;
                                psVar43 = (soplex *)&ptr_1;
                                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                  *(undefined4 *)psVar43 = *puVar37;
                                  puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                                  psVar43 = psVar43 + (ulong)bVar49 * -8 + 4;
                                }
                                puVar38 = (uint *)&local_c18;
                                pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)&perm;
                                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                  (pnVar36->m_backend).data._M_elems[0] = *puVar38;
                                  puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                                  pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                                }
                                local_dd8 = iStack_ba8;
                                local_dd4 = (bool)uStack_ba4;
                                local_dd0 = local_ba0;
                                relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                          (&result_3,(soplex *)&ptr_1,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&perm,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x0);
                                if ((NAN(RVar50)) ||
                                   (result_3.m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_0056089c:
                                  bVar3 = false;
                                }
                                else {
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result,RVar50);
                                  iVar46 = boost::multiprecision::backends::
                                           cpp_dec_float<200U,_int,_void>::compare
                                                     (&result_3.m_backend,&result.m_backend);
                                  if (0 < iVar46) goto LAB_0056089c;
                                  pnVar35 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).up.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pnVar33 = pnVar35 + lVar23;
                                  puVar37 = local_438;
                                  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                    *puVar37 = (pnVar33->m_backend).data._M_elems[0];
                                    pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar49 * -2 + 1) * 4
                                                       );
                                    puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                                  }
                                  local_1078 = *(double *)&pnVar35[lVar23].m_backend.fpclass;
                                  uStack_1070 = 0;
                                  local_c20 = 0x1c00000000;
                                  local_c98 = 0;
                                  uStack_c90 = 0;
                                  local_c88 = 0;
                                  uStack_c80 = 0;
                                  local_c78 = 0;
                                  uStack_c70 = 0;
                                  local_c68 = 0;
                                  uStack_c60 = 0;
                                  local_c58 = 0;
                                  uStack_c50 = 0;
                                  local_c48 = 0;
                                  uStack_c40 = 0;
                                  local_c38 = 0;
                                  uStack_c30 = 0;
                                  uStack_c2b = 0;
                                  iStack_c28 = 0;
                                  uStack_c24 = 0;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&local_c98,0.0);
                                  pTVar6 = (this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr;
                                  this_02 = (this->
                                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            )._tolerances.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi;
                                  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                     ) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      this_02->_M_use_count = this_02->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      this_02->_M_use_count = this_02->_M_use_count + 1;
                                    }
                                  }
                                  RVar50 = Tolerances::epsilon(pTVar6);
                                  puVar37 = local_438;
                                  psVar43 = (soplex *)&ptr_1;
                                  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                    *(undefined4 *)psVar43 = *puVar37;
                                    puVar37 = puVar37 + (ulong)bVar49 * -2 + 1;
                                    psVar43 = psVar43 + (ulong)bVar49 * -8 + 4;
                                  }
                                  puVar38 = (uint *)&local_c98;
                                  pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)&perm;
                                  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                    (pnVar36->m_backend).data._M_elems[0] = *puVar38;
                                    puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                                    pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                                  }
                                  local_dd8 = iStack_c28;
                                  local_dd4 = (bool)uStack_c24;
                                  local_dd0 = local_c20;
                                  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                            (&result_3,(soplex *)&ptr_1,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&perm,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x0);
                                  bVar3 = false;
                                  if ((!NAN(RVar50)) &&
                                     (result_3.m_backend.fpclass != cpp_dec_float_NaN)) {
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result,-RVar50);
                                    iVar46 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (&result_3.m_backend,&result.m_backend);
                                    bVar3 = 0 < iVar46;
                                  }
                                  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                     ) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (this_02);
                                  }
                                }
                                if (local_10e8 !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_10e8);
                                }
                              }
                              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (this_01);
                              }
                            }
                            if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var42)
                              ;
                            }
                            if (bVar3) {
                              pDVar17 = (DuplicateColsPS *)operator_new(0x2d0);
                              pcVar34 = &factor.m_backend;
                              pnVar36 = &local_718;
                              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                (pnVar36->m_backend).data._M_elems[0] = (pcVar34->data)._M_elems[0];
                                pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                          ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                                pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                              }
                              local_718.m_backend.exp = factor.m_backend.exp;
                              local_718.m_backend.neg = factor.m_backend.neg;
                              local_718.m_backend.fpclass = factor.m_backend.fpclass;
                              local_718.m_backend.prec_elem = factor.m_backend.prec_elem;
                              DataArray<int>::DataArray(&local_e78,&local_db0);
                              local_ff0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_ff0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi =
                                   (this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                              if (local_ff0.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_ff0.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_ff0.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_ff0.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_ff0.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              DuplicateColsPS::DuplicateColsPS
                                        (pDVar17,lp,iVar15,uVar27,&local_718,&local_e78,&local_ff0,
                                         false,false);
                              ptr_1.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = (element_type *)pDVar17;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                                        (&ptr_1.
                                          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,pDVar17);
                              if (local_ff0.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_ff0.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              if (local_e78.data != (int *)0x0) {
                                free(local_e78.data);
                                local_e78.data = (int *)0x0;
                              }
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&this_00->data,&ptr_1);
                              if (factor.m_backend.fpclass == cpp_dec_float_NaN) goto LAB_0056045e;
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar15 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 (&factor.m_backend,&result.m_backend);
                              if (iVar15 < 1) {
                                if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar15 = boost::multiprecision::backends::
                                           cpp_dec_float<200U,_int,_void>::compare
                                                     (&factor.m_backend,&result.m_backend);
                                  if (iVar15 < 0) {
                                    pcVar34 = &(lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar23].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                    if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar15 = boost::multiprecision::backends::
                                                 cpp_dec_float<200U,_int,_void>::compare
                                                           (pcVar34,&result.m_backend), 0 < iVar15))
                                    {
                                      pcVar34 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).up.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result_3.m_backend.fpclass = cpp_dec_float_finite;
                                      result_3.m_backend.prec_elem = 0x1c;
                                      result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems[0x18] = 0;
                                      result_3.m_backend.data._M_elems[0x19] = 0;
                                      result_3.m_backend.data._M_elems._104_5_ = 0;
                                      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result_3.m_backend.exp = 0;
                                      result_3.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&result_3,
                                                  local_10d8);
                                      if (((pcVar34->fpclass != cpp_dec_float_NaN) &&
                                          (result_3.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                         (iVar15 = boost::multiprecision::backends::
                                                   cpp_dec_float<200U,_int,_void>::compare
                                                             (pcVar34,&result_3.m_backend),
                                         -1 < iVar15)) goto LAB_0055ff2e;
                                      pcVar41 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar23].
                                                 m_backend;
                                      pcVar32 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).up.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                                 m_backend;
                                      result_3.m_backend.fpclass = cpp_dec_float_finite;
                                      result_3.m_backend.prec_elem = 0x1c;
                                      result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems[0x18] = 0;
                                      result_3.m_backend.data._M_elems[0x19] = 0;
                                      result_3.m_backend.data._M_elems._104_5_ = 0;
                                      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result_3.m_backend.exp = 0;
                                      result_3.m_backend.neg = false;
                                      pcVar34 = &factor.m_backend;
                                      if (&result_3.m_backend != pcVar32) {
                                        pcVar40 = &result_3.m_backend;
                                        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                          (pcVar40->data)._M_elems[0] = (pcVar34->data)._M_elems[0];
                                          pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                    ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                                          pcVar40 = (cpp_dec_float<200U,_int,_void> *)
                                                    ((long)pcVar40 + (ulong)bVar49 * -8 + 4);
                                        }
                                        result_3.m_backend.exp = factor.m_backend.exp;
                                        result_3.m_backend.neg = factor.m_backend.neg;
                                        result_3.m_backend.fpclass = factor.m_backend.fpclass;
                                        result_3.m_backend.prec_elem = factor.m_backend.prec_elem;
                                        pcVar34 = pcVar32;
                                      }
                                      boost::multiprecision::backends::
                                      cpp_dec_float<200U,_int,_void>::operator*=
                                                (&result_3.m_backend,pcVar34);
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 0x1c;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[0x18] = 0;
                                      result.m_backend.data._M_elems[0x19] = 0;
                                      result.m_backend.data._M_elems._104_5_ = 0;
                                      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      if (&result.m_backend != pcVar41) {
                                        pcVar34 = pcVar41;
                                        pcVar32 = &result.m_backend;
                                        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                          (pcVar32->data)._M_elems[0] = (pcVar34->data)._M_elems[0];
                                          pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                    ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                                          pcVar32 = (cpp_dec_float<200U,_int,_void> *)
                                                    ((long)pcVar32 + (ulong)bVar49 * -8 + 4);
                                        }
                                        result.m_backend.exp = pcVar41->exp;
                                        result.m_backend.neg = pcVar41->neg;
                                        result.m_backend.fpclass = pcVar41->fpclass;
                                        result.m_backend.prec_elem = pcVar41->prec_elem;
                                      }
                                      boost::multiprecision::backends::
                                      cpp_dec_float<200U,_int,_void>::operator+=
                                                (&result.m_backend,&result_3.m_backend);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2a])(lp,lVar23,&result,0);
                                    }
                                    else {
LAB_0055ff2e:
                                      ::soplex::infinity::__tls_init();
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 0x1c;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[0x18] = 0;
                                      result.m_backend.data._M_elems[0x19] = 0;
                                      result.m_backend.data._M_elems._104_5_ = 0;
                                      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2a])
                                                (lp,lVar23,(cpp_dec_float<200u,int,void> *)&result,0
                                                );
                                    }
                                    pcVar34 = &(lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).up.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar23].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result,local_10d8);
                                    if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar15 = boost::multiprecision::backends::
                                                 cpp_dec_float<200U,_int,_void>::compare
                                                           (pcVar34,&result.m_backend), iVar15 < 0))
                                    {
                                      pcVar34 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result_3.m_backend.fpclass = cpp_dec_float_finite;
                                      result_3.m_backend.prec_elem = 0x1c;
                                      result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result_3.m_backend.data._M_elems[0x18] = 0;
                                      result_3.m_backend.data._M_elems[0x19] = 0;
                                      result_3.m_backend.data._M_elems._104_5_ = 0;
                                      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result_3.m_backend.exp = 0;
                                      result_3.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&result_3,a);
                                      if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                          (result_3.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                         (iVar15 = boost::multiprecision::backends::
                                                   cpp_dec_float<200U,_int,_void>::compare
                                                             (pcVar34,&result_3.m_backend),
                                         0 < iVar15)) {
                                        pcVar32 = &(lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).up.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar23].
                                                  m_backend;
                                        pcVar41 = &(lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).low.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                                  m_backend;
                                        result_3.m_backend.fpclass = cpp_dec_float_finite;
                                        result_3.m_backend.prec_elem = 0x1c;
                                        result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                        result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                        result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                        result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                        result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                        result_3.m_backend.data._M_elems[0x18] = 0;
                                        result_3.m_backend.data._M_elems[0x19] = 0;
                                        result_3.m_backend.data._M_elems._104_5_ = 0;
                                        result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                        result_3.m_backend.exp = 0;
                                        result_3.m_backend.neg = false;
                                        pcVar34 = &factor.m_backend;
                                        if (&result_3.m_backend != pcVar41) {
                                          pcVar40 = &result_3.m_backend;
                                          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                            (pcVar40->data)._M_elems[0] =
                                                 (pcVar34->data)._M_elems[0];
                                            pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                      ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                                            pcVar40 = (cpp_dec_float<200U,_int,_void> *)
                                                      ((long)pcVar40 + (ulong)bVar49 * -8 + 4);
                                          }
                                          result_3.m_backend.exp = factor.m_backend.exp;
                                          result_3.m_backend.neg = factor.m_backend.neg;
                                          result_3.m_backend.fpclass = factor.m_backend.fpclass;
                                          result_3.m_backend.prec_elem = factor.m_backend.prec_elem;
                                          pcVar34 = pcVar41;
                                        }
                                        boost::multiprecision::backends::
                                        cpp_dec_float<200U,_int,_void>::operator*=
                                                  (&result_3.m_backend,pcVar34);
                                        result.m_backend.fpclass = cpp_dec_float_finite;
                                        result.m_backend.prec_elem = 0x1c;
                                        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems[0x18] = 0;
                                        result.m_backend.data._M_elems[0x19] = 0;
                                        result.m_backend.data._M_elems._104_5_ = 0;
                                        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                        result.m_backend.exp = 0;
                                        result.m_backend.neg = false;
                                        if (&result.m_backend != pcVar32) {
                                          pcVar34 = pcVar32;
                                          pcVar41 = &result.m_backend;
                                          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                            (pcVar41->data)._M_elems[0] =
                                                 (pcVar34->data)._M_elems[0];
                                            pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                      ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                                            pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                                                      ((long)pcVar41 + (ulong)bVar49 * -8 + 4);
                                          }
                                          result.m_backend.exp = pcVar32->exp;
                                          result.m_backend.neg = pcVar32->neg;
                                          result.m_backend.fpclass = pcVar32->fpclass;
                                          result.m_backend.prec_elem = pcVar32->prec_elem;
                                        }
                                        boost::multiprecision::backends::
                                        cpp_dec_float<200U,_int,_void>::operator+=
                                                  (&result.m_backend,&result_3.m_backend);
                                        (*(lp->
                                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .
                                          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._vptr_ClassArray[0x2d])(lp,(ulong)uVar27,&result,0);
                                        goto LAB_0056045e;
                                      }
                                    }
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result,local_10d8);
                                    (*(lp->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .
                                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._vptr_ClassArray[0x2d])
                                              (lp,lVar23,(cpp_dec_float<200u,int,void> *)&result,0);
                                  }
                                }
                              }
                              else {
                                pcVar34 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).low.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar23].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar15 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (pcVar34,&result.m_backend), 0 < iVar15)) {
                                  pcVar34 = &(lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).low.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result_3.m_backend.fpclass = cpp_dec_float_finite;
                                  result_3.m_backend.prec_elem = 0x1c;
                                  result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems[0x18] = 0;
                                  result_3.m_backend.data._M_elems[0x19] = 0;
                                  result_3.m_backend.data._M_elems._104_5_ = 0;
                                  result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result_3.m_backend.exp = 0;
                                  result_3.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result_3,a);
                                  if (((pcVar34->fpclass != cpp_dec_float_NaN) &&
                                      (result_3.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                     (iVar15 = boost::multiprecision::backends::
                                               cpp_dec_float<200U,_int,_void>::compare
                                                         (pcVar34,&result_3.m_backend), iVar15 < 1))
                                  goto LAB_00560055;
                                  pnVar35 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).low.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pcVar32 = &pnVar35[lVar21].m_backend;
                                  result_3.m_backend.fpclass = cpp_dec_float_finite;
                                  result_3.m_backend.prec_elem = 0x1c;
                                  result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems[0x18] = 0;
                                  result_3.m_backend.data._M_elems[0x19] = 0;
                                  result_3.m_backend.data._M_elems._104_5_ = 0;
                                  result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result_3.m_backend.exp = 0;
                                  result_3.m_backend.neg = false;
                                  pcVar34 = &factor.m_backend;
                                  if (&result_3.m_backend != pcVar32) {
                                    pcVar41 = &result_3.m_backend;
                                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                      (pcVar41->data)._M_elems[0] = (pcVar34->data)._M_elems[0];
                                      pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                                      pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar41 + (ulong)bVar49 * -8 + 4);
                                    }
                                    result_3.m_backend.exp = factor.m_backend.exp;
                                    result_3.m_backend.neg = factor.m_backend.neg;
                                    result_3.m_backend.fpclass = factor.m_backend.fpclass;
                                    result_3.m_backend.prec_elem = factor.m_backend.prec_elem;
                                    pcVar34 = pcVar32;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  operator*=(&result_3.m_backend,pcVar34);
                                  pcVar34 = &pnVar35[lVar23].m_backend;
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  if (&result.m_backend != pcVar34) {
                                    pcVar32 = pcVar34;
                                    pcVar41 = &result.m_backend;
                                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                      (pcVar41->data)._M_elems[0] = (pcVar32->data)._M_elems[0];
                                      pcVar32 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar32 + (ulong)bVar49 * -8 + 4);
                                      pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar41 + (ulong)bVar49 * -8 + 4);
                                    }
                                    result.m_backend.exp = pcVar34->exp;
                                    result.m_backend.neg = pcVar34->neg;
                                    result.m_backend.fpclass = pcVar34->fpclass;
                                    result.m_backend.prec_elem = pcVar34->prec_elem;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  operator+=(&result.m_backend,&result_3.m_backend);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])(lp,lVar23,&result,0);
                                }
                                else {
LAB_00560055:
                                  ::soplex::infinity::__tls_init();
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])
                                            (lp,lVar23,(cpp_dec_float<200u,int,void> *)&result,0);
                                }
                                pcVar34 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar23].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,local_10d8);
                                if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar15 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (pcVar34,&result.m_backend), iVar15 < 0)) {
                                  pcVar34 = &(lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result_3.m_backend.fpclass = cpp_dec_float_finite;
                                  result_3.m_backend.prec_elem = 0x1c;
                                  result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result_3.m_backend.data._M_elems[0x18] = 0;
                                  result_3.m_backend.data._M_elems[0x19] = 0;
                                  result_3.m_backend.data._M_elems._104_5_ = 0;
                                  result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result_3.m_backend.exp = 0;
                                  result_3.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result_3,local_10d8);
                                  if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                      (result_3.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                     (iVar15 = boost::multiprecision::backends::
                                               cpp_dec_float<200U,_int,_void>::compare
                                                         (pcVar34,&result_3.m_backend), iVar15 < 0))
                                  {
                                    pnVar35 = (lp->
                                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).up.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                    pcVar32 = &pnVar35[lVar21].m_backend;
                                    result_3.m_backend.fpclass = cpp_dec_float_finite;
                                    result_3.m_backend.prec_elem = 0x1c;
                                    result_3.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result_3.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result_3.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result_3.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result_3.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result_3.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result_3.m_backend.data._M_elems[0x18] = 0;
                                    result_3.m_backend.data._M_elems[0x19] = 0;
                                    result_3.m_backend.data._M_elems._104_5_ = 0;
                                    result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result_3.m_backend.exp = 0;
                                    result_3.m_backend.neg = false;
                                    pcVar34 = &factor.m_backend;
                                    if (&result_3.m_backend != pcVar32) {
                                      pcVar41 = &result_3.m_backend;
                                      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                        (pcVar41->data)._M_elems[0] = (pcVar34->data)._M_elems[0];
                                        pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                  ((long)pcVar34 + (ulong)bVar49 * -8 + 4);
                                        pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                                                  ((long)pcVar41 + (ulong)bVar49 * -8 + 4);
                                      }
                                      result_3.m_backend.exp = factor.m_backend.exp;
                                      result_3.m_backend.neg = factor.m_backend.neg;
                                      result_3.m_backend.fpclass = factor.m_backend.fpclass;
                                      result_3.m_backend.prec_elem = factor.m_backend.prec_elem;
                                      pcVar34 = pcVar32;
                                    }
                                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>
                                    ::operator*=(&result_3.m_backend,pcVar34);
                                    pcVar34 = &pnVar35[lVar23].m_backend;
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    if (&result.m_backend != pcVar34) {
                                      pcVar32 = pcVar34;
                                      pcVar41 = &result.m_backend;
                                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                        (pcVar41->data)._M_elems[0] = (pcVar32->data)._M_elems[0];
                                        pcVar32 = (cpp_dec_float<200U,_int,_void> *)
                                                  ((long)pcVar32 + (ulong)bVar49 * -8 + 4);
                                        pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                                                  ((long)pcVar41 + (ulong)bVar49 * -8 + 4);
                                      }
                                      result.m_backend.exp = pcVar34->exp;
                                      result.m_backend.neg = pcVar34->neg;
                                      result.m_backend.fpclass = pcVar34->fpclass;
                                      result.m_backend.prec_elem = pcVar34->prec_elem;
                                    }
                                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>
                                    ::operator+=(&result.m_backend,&result_3.m_backend);
                                    (*(lp->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .
                                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._vptr_ClassArray[0x2d])(lp,(ulong)uVar27,&result,0);
                                    goto LAB_0056045e;
                                  }
                                }
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,local_10d8);
                                (*(lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._vptr_ClassArray[0x2d])
                                          (lp,lVar23,(cpp_dec_float<200u,int,void> *)&result,0);
                              }
LAB_0056045e:
                              local_1050[lVar21] = true;
                              piVar8 = (this->m_stat).data + 0xe;
                              *piVar8 = *piVar8 + 1;
                              if (ptr_1.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (ptr_1.
                                           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                            }
                          }
                          pDVar19 = (this->m_dupCols).data.
                                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                      }
                    }
                    lVar47 = lVar47 + 1;
                    pDVar25 = pDVar19 + lVar28;
                    lVar29 = lVar29 + 0x84;
                  } while (lVar47 < (pDVar25->
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).memused);
                }
                local_1068 = local_1068 + 1;
              } while (local_1068 <
                       pDVar19[lVar28].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused);
            }
          }
          lVar28 = lVar28 + 1;
          uVar27 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
          uVar22 = (ulong)(int)uVar27;
        } while (lVar28 < (long)uVar22);
        if (0 < (int)uVar27) {
          lVar28 = 0;
          do {
            if (local_e58[lVar28] == true) {
              fixColumn(this,lp,(int)lVar28,false);
              uVar22 = (ulong)(uint)(lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.thenum;
            }
            lVar28 = lVar28 + 1;
            uVar27 = (uint)uVar22;
          } while (lVar28 < (int)uVar27);
        }
      }
      perm = (int *)0x0;
      spx_alloc<int*>(&perm,uVar27);
      uVar22 = (ulong)uVar27;
      if ((int)uVar27 < 1) {
        uVar30 = 0;
        iVar15 = 0;
      }
      else {
        pIVar4 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        pDVar7 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey;
        uVar44 = 0;
        iVar15 = 0;
        uVar30 = 0;
        do {
          if (local_1050[uVar44] == true) {
            perm[uVar44] = -1;
            uVar30 = uVar30 + 1;
            iVar15 = iVar15 + pIVar4[pDVar7[uVar44].idx].data.
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused;
          }
          else {
            perm[uVar44] = 0;
          }
          uVar44 = uVar44 + 1;
        } while (uVar22 != uVar44);
      }
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x17])(lp,perm);
      if (0 < (int)uVar27) {
        piVar8 = (this->m_cIdx).data;
        uVar44 = 0;
        do {
          if (-1 < (long)perm[uVar44]) {
            piVar8[perm[uVar44]] = piVar8[uVar44];
          }
          uVar44 = uVar44 + 1;
        } while (uVar22 != uVar44);
      }
      ptr_1.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar16 = 0;
      if (0 < (int)uVar27) {
        uVar16 = uVar27;
      }
      n = 1;
      if (0 < (int)uVar27) {
        n = uVar16;
      }
      ptr_1.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)CONCAT44(n,uVar16);
      spx_alloc<int*>((int **)&ptr_1.
                               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,n);
      if (0 < (int)uVar27) {
        uVar44 = 0;
        do {
          *(int *)((long)&(ptr_1.
                           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_vptr__Sp_counted_base + uVar44 * 4) = perm[uVar44];
          uVar44 = uVar44 + 1;
        } while (uVar22 != uVar44);
      }
      if (bVar48) {
        pDVar17 = (DuplicateColsPS *)operator_new(0x2d0);
        local_40._0_4_ = cpp_dec_float_finite;
        local_40._4_4_ = 0x1c;
        local_b8 = (undefined1  [16])0x0;
        local_a8 = (undefined1  [16])0x0;
        local_98 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_58 = SUB1613((undefined1  [16])0x0,0);
        uStack_4b = 0;
        uStack_48._0_4_ = 0;
        uStack_48._4_1_ = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_b8,1.0);
        DataArray<int>::DataArray(&local_e90,(DataArray<int> *)&ptr_1);
        local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        DuplicateColsPS::DuplicateColsPS
                  (pDVar17,lp,0,0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b8,&local_e90,&local_1040,false,true);
        result.m_backend.data._M_elems._0_8_ = pDVar17;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2),pDVar17);
        if (local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1040.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_e90.data != (int *)0x0) {
          free(local_e90.data);
          local_e90.data = (int *)0x0;
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&(this->m_hist).data,(value_type *)&result);
        if (result.m_backend.data._M_elems._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     result.m_backend.data._M_elems._8_8_);
        }
      }
      free(perm);
      perm = (int *)0x0;
      if (0 < (int)uVar30) {
        piVar8 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remCols;
        *piVar8 = *piVar8 + uVar30;
        piVar8 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remNzos;
        *piVar8 = *piVar8 + iVar15;
        pSVar20 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar20->m_verbosity;
          result_3.m_backend.data._M_elems[0] = 4;
          (*pSVar20->_vptr_SPxOut[2])();
          pSVar20 = soplex::operator<<((this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (duplicate columns) removed ");
          std::ostream::operator<<((ostream *)pSVar20->m_streams[pSVar20->m_verbosity],uVar30);
          pSVar20 = soplex::operator<<(pSVar20," cols, ");
          std::ostream::operator<<((ostream *)pSVar20->m_streams[pSVar20->m_verbosity],iVar15);
          pSVar20 = soplex::operator<<(pSVar20," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar20->m_streams[pSVar20->m_verbosity]);
          pSVar20 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar20->_vptr_SPxOut[2])(pSVar20,&result);
        }
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x1c;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems[6] = 0;
        result_3.m_backend.data._M_elems[7] = 0;
        result_3.m_backend.data._M_elems[8] = 0;
        result_3.m_backend.data._M_elems[9] = 0;
        result_3.m_backend.data._M_elems[10] = 0;
        result_3.m_backend.data._M_elems[0xb] = 0;
        result_3.m_backend.data._M_elems[0xc] = 0;
        result_3.m_backend.data._M_elems[0xd] = 0;
        result_3.m_backend.data._M_elems[0xe] = 0;
        result_3.m_backend.data._M_elems[0xf] = 0;
        result_3.m_backend.data._M_elems[0x10] = 0;
        result_3.m_backend.data._M_elems[0x11] = 0;
        result_3.m_backend.data._M_elems[0x12] = 0;
        result_3.m_backend.data._M_elems[0x13] = 0;
        result_3.m_backend.data._M_elems[0x14] = 0;
        result_3.m_backend.data._M_elems[0x15] = 0;
        result_3.m_backend.data._M_elems[0x16] = 0;
        result_3.m_backend.data._M_elems[0x17] = 0;
        result_3.m_backend.data._M_elems[0x18] = 0;
        result_3.m_backend.data._M_elems[0x19] = 0;
        result_3.m_backend.data._M_elems._104_5_ = 0;
        result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&result.m_backend,(long)(int)uVar27,(type *)0x0);
        pnVar36 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_minReduction;
        if (&result_3 != pnVar36) {
          pnVar45 = &result_3;
          for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
            (pnVar45->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
            pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar36 + (ulong)bVar49 * -8 + 4);
            pnVar45 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar45 + ((ulong)bVar49 * -2 + 1) * 4);
          }
          result_3.m_backend.exp =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.exp;
          result_3.m_backend.neg =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.neg;
          result_3.m_backend.fpclass =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.fpclass;
          result_3.m_backend.prec_elem =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_3.m_backend,&result.m_backend);
        if (result_3.m_backend.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&result.m_backend,(ulong)uVar30,(type *)0x0);
          iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&result_3.m_backend,&result.m_backend);
          if (iVar15 < 0) {
            *again = true;
          }
        }
      }
      if (ptr_1.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        free(ptr_1.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
      }
      RVar12 = OKAY;
LAB_00561849:
      if (local_db0.data != (int *)0x0) {
        free(local_db0.data);
      }
      if (local_e58 != (bool *)0x0) {
        free(local_e58);
      }
      if (local_1050 != (bool *)0x0) {
        free(local_1050);
      }
      if (scale.data.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_fc8 != (int *)0x0) {
        free(local_fc8);
      }
      if (local_1088 != (int *)0x0) {
        free(local_1088);
      }
    }
  }
  return RVar12;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}